

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timTrav.c
# Opt level: O2

void Tim_ManIncrementTravId(Tim_Man_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  
  uVar3 = p->nTravIds;
  if (0x3ffffffe < (int)uVar3) {
    iVar1 = p->nCis;
    lVar4 = 4;
    for (lVar5 = 0; lVar5 < iVar1; lVar5 = lVar5 + 1) {
      *(undefined4 *)((long)&p->pCis->Id + lVar4) = 0;
      lVar4 = lVar4 + 0x18;
    }
    uVar3 = 0;
    uVar2 = p->nCos;
    if (p->nCos < 1) {
      uVar2 = uVar3;
    }
    for (lVar4 = 0; (ulong)uVar2 * 0x18 - lVar4 != 0; lVar4 = lVar4 + 0x18) {
      *(undefined4 *)((long)&p->pCos->TravId + lVar4) = 0;
    }
  }
  p->nTravIds = uVar3 + 1;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Increments the trav ID of the manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Tim_ManIncrementTravId( Tim_Man_t * p )
{
    int i;
    if ( p->nTravIds >= (1<<30)-1 )
    {
        p->nTravIds = 0;
        for ( i = 0; i < p->nCis; i++ )
            p->pCis[i].TravId = 0;
        for ( i = 0; i < p->nCos; i++ )
            p->pCos[i].TravId = 0;
    }
    assert( p->nTravIds < (1<<30)-1 );
    p->nTravIds++;
}